

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRpm.c
# Opt level: O2

void Abs_ManSupport1_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vSupp)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  
  while( true ) {
    iVar2 = Gia_ObjIsTravIdCurrent(p,pObj);
    if (iVar2 != 0) {
      return;
    }
    Gia_ObjSetTravIdCurrent(p,pObj);
    uVar1 = *(ulong *)pObj;
    if ((uVar1 >> 0x3e & 1) != 0) break;
    iVar2 = Gia_ObjIsRo(p,pObj);
    if (iVar2 != 0) break;
    uVar3 = (uint)uVar1;
    if (((int)uVar3 < 0) || (uVar3 = uVar3 & 0x1fffffff, uVar3 == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absRpm.c"
                    ,0x1d4,"void Abs_ManSupport1_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
    }
    Abs_ManSupport1_rec(p,pObj + -(ulong)uVar3,vSupp);
    pObj = pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff);
  }
  iVar2 = Gia_ObjId(p,pObj);
  Vec_IntPush(vSupp,iVar2);
  return;
}

Assistant:

void Abs_ManSupport1_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vSupp )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return;
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( pObj->fMark1 || Gia_ObjIsRo(p, pObj) )
    {
        Vec_IntPush( vSupp, Gia_ObjId(p, pObj) );
        return;
    }
    assert( Gia_ObjIsAnd(pObj) );
    Abs_ManSupport1_rec( p, Gia_ObjFanin0(pObj), vSupp );
    Abs_ManSupport1_rec( p, Gia_ObjFanin1(pObj), vSupp );
}